

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O2

bool __thiscall
candidate_index::CandidateIndex::structural_filter
          (CandidateIndex *this,
          vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
          *r,vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
             *s,double t,int olap,int pr,int ps,int distance_threshold,int maxr,int maxs)

{
  pointer pLVar1;
  pointer pLVar2;
  int iVar3;
  LabelSetElement *sv_r;
  LabelSetElement *sv_s;
  
  pLVar1 = (r->
           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (s->
           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
LAB_001047bd:
  do {
    sv_s = pLVar2 + ps;
    sv_r = pLVar1 + pr;
    while( true ) {
      if ((((double)maxr < t) || ((double)maxs < t)) || (t <= (double)olap)) {
        return t <= (double)olap;
      }
      if (sv_r->id == sv_s->id) {
        iVar3 = structural_mapping(this,sv_r,sv_s,(double)distance_threshold);
        olap = olap + iVar3;
        maxr = (maxr + iVar3) - sv_r->weight;
        maxs = (maxs + iVar3) - sv_s->weight;
        pr = pr + 1;
        ps = ps + 1;
        goto LAB_001047bd;
      }
      if (sv_s->id <= sv_r->id) break;
      maxr = maxr - sv_r->weight;
      pr = pr + 1;
      sv_r = sv_r + 1;
    }
    maxs = maxs - sv_s->weight;
    ps = ps + 1;
  } while( true );
}

Assistant:

bool CandidateIndex::structural_filter(
    std::vector<label_set_converter::LabelSetElement>& r, 
    std::vector<label_set_converter::LabelSetElement>& s, 
    const double t, 
    int olap, 
    int pr, 
    int ps, 
    int distance_threshold, 
    int maxr, 
    int maxs) {

  // starting from pr and ps, check if the overlap exceeds the threshold
  // stop if the threshold is reached or cannot be reached anymore
  while (maxr >= t && maxs >= t && olap < t) {
    if (r[pr].id == s[ps].id) {
      int tau_valid = structural_mapping(r[pr], s[ps], distance_threshold);
      olap += tau_valid;
      maxr -= r[pr].weight - tau_valid;
      maxs -= s[ps].weight - tau_valid;
      ++pr; ++ps; 
    } else if (r[pr].id < s[ps].id) {
      maxr -= r[pr].weight;
      ++pr;
    } else {
      maxs -= s[ps].weight;
      ++ps;
    }
  }

  return olap >= t;
}